

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::SharedCtor
          (TreeEnsembleParameters_TreeNode *this)

{
  TreeEnsembleParameters_TreeNode *this_local;
  
  memset(&this->treeid_,0,0x40);
  return;
}

Assistant:

inline void TreeEnsembleParameters_TreeNode::SharedCtor() {
::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(
    reinterpret_cast<char*>(&treeid_) - reinterpret_cast<char*>(this)),
    0, static_cast<size_t>(reinterpret_cast<char*>(&relativehitrate_) -
    reinterpret_cast<char*>(&treeid_)) + sizeof(relativehitrate_));
}